

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int xpathCommonTest(char *filename,char *result,int xptr,int expr)

{
  code *pcVar1;
  int iVar2;
  char *__filename;
  undefined8 *puVar3;
  char *pcVar4;
  size_t sVar5;
  bool bVar6;
  char *temp;
  int ret;
  int len;
  char expression [5000];
  FILE *input;
  int expr_local;
  int xptr_local;
  char *result_local;
  char *filename_local;
  
  temp._0_4_ = 0;
  __filename = resultFilename(filename,temp_directory,".res");
  if (__filename == (char *)0x0) {
    fprintf(_stderr,"Out of memory\n");
    fatalError();
  }
  xpathOutput = (FILE *)fopen64(__filename,"wb");
  if ((FILE *)xpathOutput == (FILE *)0x0) {
    fprintf(_stderr,"failed to open output file %s\n",__filename);
    free(__filename);
    filename_local._4_4_ = -1;
  }
  else {
    expression._4992_8_ = fopen64(filename,"rb");
    if ((FILE *)expression._4992_8_ == (FILE *)0x0) {
      puVar3 = (undefined8 *)__xmlGenericError();
      pcVar1 = (code *)*puVar3;
      puVar3 = (undefined8 *)__xmlGenericErrorContext();
      (*pcVar1)(*puVar3,"Cannot open %s for reading\n",filename);
      free(__filename);
      filename_local._4_4_ = -1;
    }
    else {
      while (pcVar4 = fgets((char *)&ret,0x1194,(FILE *)expression._4992_8_), pcVar4 != (char *)0x0)
      {
        sVar5 = strlen((char *)&ret);
        temp._4_4_ = (int)sVar5;
        do {
          iVar2 = temp._4_4_;
          temp._4_4_ = iVar2 + -1;
          bVar6 = false;
          if ((((-1 < temp._4_4_) &&
               (bVar6 = true, *(char *)((long)&ret + (long)temp._4_4_) != '\n')) &&
              (bVar6 = true, *(char *)((long)&ret + (long)temp._4_4_) != '\t')) &&
             (bVar6 = true, *(char *)((long)&ret + (long)temp._4_4_) != '\r')) {
            bVar6 = *(char *)((long)&ret + (long)temp._4_4_) == ' ';
          }
        } while (bVar6);
        *(undefined1 *)((long)&ret + (long)iVar2) = 0;
        if (-1 < temp._4_4_) {
          fprintf((FILE *)xpathOutput,"\n========================\nExpression: %s\n",&ret);
          testXPath((char *)&ret,xptr,expr);
        }
      }
      fclose((FILE *)expression._4992_8_);
      fclose((FILE *)xpathOutput);
      if ((result != (char *)0x0) && (temp._0_4_ = compareFiles(__filename,result), (int)temp != 0))
      {
        fprintf(_stderr,"Result for %s failed in %s\n",filename,result);
      }
      if (__filename != (char *)0x0) {
        unlink(__filename);
        free(__filename);
      }
      filename_local._4_4_ = (int)temp;
    }
  }
  return filename_local._4_4_;
}

Assistant:

static int
xpathCommonTest(const char *filename, const char *result,
                int xptr, int expr) {
    FILE *input;
    char expression[5000];
    int len, ret = 0;
    char *temp;

    temp = resultFilename(filename, temp_directory, ".res");
    if (temp == NULL) {
        fprintf(stderr, "Out of memory\n");
        fatalError();
    }
    xpathOutput = fopen(temp, "wb");
    if (xpathOutput == NULL) {
	fprintf(stderr, "failed to open output file %s\n", temp);
        free(temp);
	return(-1);
    }

    input = fopen(filename, "rb");
    if (input == NULL) {
        xmlGenericError(xmlGenericErrorContext,
		"Cannot open %s for reading\n", filename);
        free(temp);
	return(-1);
    }
    while (fgets(expression, 4500, input) != NULL) {
	len = strlen(expression);
	len--;
	while ((len >= 0) &&
	       ((expression[len] == '\n') || (expression[len] == '\t') ||
		(expression[len] == '\r') || (expression[len] == ' '))) len--;
	expression[len + 1] = 0;
	if (len >= 0) {
	    fprintf(xpathOutput,
	            "\n========================\nExpression: %s\n",
		    expression) ;
	    testXPath(expression, xptr, expr);
	}
    }

    fclose(input);
    fclose(xpathOutput);
    if (result != NULL) {
	ret = compareFiles(temp, result);
	if (ret) {
	    fprintf(stderr, "Result for %s failed in %s\n", filename, result);
	}
    }

    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }
    return(ret);
}